

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isCubeMipmapLinearSampleResultValid
               (ConstPixelBufferAccess (*faces0) [6],ConstPixelBufferAccess (*faces1) [6],
               Sampler *sampler,FilterMode levelFilter,LookupPrecision *prec,
               CubeFaceFloatCoords *coords,Vec2 *fBounds,Vec4 *result)

{
  Sampler *pSVar1;
  CubeFace CVar2;
  int dim;
  int dim_00;
  TextureFormat format;
  TextureFormat format_00;
  TextureFormat format_01;
  TextureFormat format_02;
  TextureFormat format_03;
  TextureFormat format_04;
  TextureFormat format_05;
  TextureFormat format_06;
  undefined1 auVar3 [16];
  void *pvVar4;
  LookupPrecision *prec_00;
  bool bVar5;
  TextureChannelClass TVar6;
  TextureChannelClass extraout_EAX;
  uint uVar7;
  TextureChannelClass extraout_EAX_00;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  CubeFaceFloatCoords *pCVar14;
  Vec2 *pVVar15;
  Vec2 *yBounds0;
  Vec2 *xBounds1;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  CubeFaceIntCoords CVar26;
  CubeFaceIntCoords CVar27;
  CubeFaceIntCoords CVar28;
  CubeFaceIntCoords CVar29;
  undefined4 in_stack_fffffffffffffddc;
  Vec2 *in_stack_fffffffffffffde0;
  undefined4 uVar30;
  Vec4 *in_stack_fffffffffffffde8;
  undefined4 uVar31;
  undefined1 local_1f8 [32];
  void *local_1d8;
  ulong local_1d0;
  float local_1c4;
  ulong local_1c0;
  CubeFace local_1b8;
  undefined4 uStack_1b4;
  long local_1b0;
  Vec2 *local_1a8;
  Sampler *local_1a0;
  TextureFormat local_198;
  int aiStack_190 [4];
  ConstPixelBufferAccess (*local_180) [6];
  LookupPrecision *local_178;
  CubeFaceFloatCoords *local_170;
  float local_168;
  int local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  int local_148;
  float local_144;
  ConstPixelBufferAccess (*local_140) [6];
  ColorQuad quad1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 vBounds1;
  Vec2 uBounds0;
  ColorQuad quad0;
  
  if (levelFilter == LINEAR) {
    CVar2 = coords->face;
    if (sampler->seamlessCubeMap == true) {
      dim = (*faces0)[CVar2].m_size.m_data[0];
      dim_00 = (*faces1)[CVar2].m_size.m_data[0];
      local_180 = faces0;
      local_140 = faces1;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_00,coords->s,
                 (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      local_1a0 = sampler;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_00,coords->t,
                 (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
      fVar17 = floorf(uBounds0.m_data[0] + -0.5);
      local_1d8 = (void *)CONCAT44(local_1d8._4_4_,fVar17);
      fVar17 = floorf(uBounds0.m_data[1] + -0.5);
      local_1a8 = (Vec2 *)CONCAT44(local_1a8._4_4_,fVar17);
      fVar17 = floorf(uBounds1.m_data[0] + -0.5);
      local_1f8._28_4_ = floorf(uBounds1.m_data[1] + -0.5);
      fVar18 = floorf(vBounds0.m_data[0] + -0.5);
      fVar19 = floorf(vBounds0.m_data[1] + -0.5);
      fVar20 = floorf(vBounds1.m_data[0] + -0.5);
      fVar21 = floorf(vBounds1.m_data[1] + -0.5);
      local_1b0 = CONCAT44(local_1b0._4_4_,fVar21);
      local_170 = coords;
      TVar6 = getTextureChannelClass((*local_180)[coords->face].m_format.type);
      if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
        local_1c4 = computeBilinearSearchStepForSnorm(prec);
      }
      else {
        local_1c4 = 0.0;
        if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
          local_1c4 = computeBilinearSearchStepForUnorm(prec);
        }
      }
      if ((int)fVar19 < (int)fVar18) {
        bVar5 = false;
      }
      else {
        fVar21 = (float)(int)local_1d8._0_4_;
        iVar10 = (int)local_1a8._0_4_;
        local_160 = (float)(int)fVar17;
        local_148 = (int)(float)local_1f8._28_4_;
        local_168 = (float)(int)fVar20;
        local_164 = (int)(float)local_1b0;
        pCVar14 = local_170;
        local_178 = prec;
        fVar17 = (float)(int)fVar18;
        do {
          local_15c = (float)((int)fVar17 + 1);
          if ((int)fVar21 <= iVar10) {
            fVar18 = fVar21;
            local_1f8._24_4_ = TVar6;
            do {
              quad0.p11.m_data[0] = 0.0;
              quad0.p11.m_data[1] = 0.0;
              quad0.p11.m_data[2] = 0.0;
              quad0.p11.m_data[3] = 0.0;
              quad0.p10.m_data[0] = 0.0;
              quad0.p10.m_data[1] = 0.0;
              quad0.p10.m_data[2] = 0.0;
              quad0.p10.m_data[3] = 0.0;
              quad0.p01.m_data[0] = 0.0;
              quad0.p01.m_data[1] = 0.0;
              quad0.p01.m_data[2] = 0.0;
              quad0.p01.m_data[3] = 0.0;
              quad0.p00.m_data[0] = 0.0;
              quad0.p00.m_data[1] = 0.0;
              quad0.p00.m_data[2] = 0.0;
              quad0.p00.m_data[3] = 0.0;
              quad1.p00.m_data[1] = fVar18;
              quad1.p00.m_data[0] = (float)pCVar14->face;
              quad1.p00.m_data[2] = fVar17;
              CVar26 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
              local_1f8._28_4_ = CVar26.t;
              fVar13 = (float)((int)fVar18 + 1);
              quad1.p00.m_data[1] = fVar13;
              quad1.p00.m_data[0] = (float)pCVar14->face;
              quad1.p00.m_data[2] = fVar17;
              CVar27 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
              fVar20 = local_15c;
              iVar11 = CVar27.t;
              quad1.p00.m_data[1] = fVar18;
              quad1.p00.m_data[0] = (float)pCVar14->face;
              quad1.p00.m_data[2] = local_15c;
              local_1d8 = (void *)(ulong)(uint)fVar18;
              CVar28 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
              uVar8 = CVar28._0_8_;
              local_1a8 = (Vec2 *)CONCAT44(local_1a8._4_4_,CVar28.t);
              quad1.p00.m_data[1] = fVar13;
              quad1.p00.m_data[0] = (float)pCVar14->face;
              quad1.p00.m_data[2] = fVar20;
              CVar29 = remapCubeEdgeCoords((CubeFaceIntCoords *)&quad1,dim);
              iVar12 = CVar29.t;
              local_1b0 = CVar29._0_8_;
              uVar9 = CVar26._0_8_ & 0xffffffff;
              if ((((uVar9 == 6) || (local_1c0 = uVar8 & 0xffffffff, CVar28.face == CUBEFACE_LAST))
                  || (uVar16 = CVar27._0_8_ & 0xffffffff, CVar27.face == CUBEFACE_LAST)) ||
                 (local_1b8 = CVar29.face, local_1b8 == CUBEFACE_LAST)) {
                return true;
              }
              uStack_1b4 = 0;
              pSVar1 = (Sampler *)(*local_180 + uVar9);
              if ((((long)CVar26._0_8_ < 0) || ((*local_180)[uVar9].m_size.m_data[0] <= CVar26.s))
                 || (((int)local_1f8._28_4_ < 0 ||
                     (((int)pSVar1->minFilter <= (int)local_1f8._28_4_ ||
                      ((int)pSVar1->magFilter < 1)))))) {
                sampleTextureBorder<float>((TextureFormat *)local_1f8,pSVar1);
              }
              else {
                local_1d0 = uVar8;
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pSVar1,CVar26.s,local_1f8._28_4_);
                format.order = pSVar1->wrapS;
                format.type = pSVar1->wrapT;
                bVar5 = isSRGB(format);
                if (bVar5) {
                  sRGBToLinear((tcu *)local_1f8,&quad1.p00);
                  uVar8 = local_1d0;
                }
                else {
                  local_1f8._0_4_ = quad1.p00.m_data[0];
                  local_1f8._4_4_ = quad1.p00.m_data[1];
                  local_1f8._8_4_ = quad1.p00.m_data[2];
                  local_1f8._12_4_ = quad1.p00.m_data[3];
                  uVar8 = local_1d0;
                }
              }
              quad0.p00.m_data[0] = (float)local_1f8._0_4_;
              quad0.p00.m_data[1] = (float)local_1f8._4_4_;
              quad0.p00.m_data[2] = (float)local_1f8._8_4_;
              quad0.p00.m_data[3] = (float)local_1f8._12_4_;
              pSVar1 = (Sampler *)(*local_180 + uVar16);
              if (((((long)CVar27._0_8_ < 0) || ((*local_180)[uVar16].m_size.m_data[0] <= CVar27.s))
                  || (iVar11 < 0)) ||
                 (((int)pSVar1->minFilter <= iVar11 || ((int)pSVar1->magFilter < 1)))) {
                sampleTextureBorder<float>((TextureFormat *)local_1f8,pSVar1);
              }
              else {
                local_1d0 = uVar8;
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pSVar1,CVar27.s,iVar11);
                format_00.order = pSVar1->wrapS;
                format_00.type = pSVar1->wrapT;
                bVar5 = isSRGB(format_00);
                if (bVar5) {
                  sRGBToLinear((tcu *)local_1f8,&quad1.p00);
                }
                else {
                  local_1f8._0_4_ = quad1.p00.m_data[0];
                  local_1f8._4_4_ = quad1.p00.m_data[1];
                  local_1f8._8_4_ = quad1.p00.m_data[2];
                  local_1f8._12_4_ = quad1.p00.m_data[3];
                }
                uVar8 = local_1d0;
              }
              pCVar14 = local_170;
              quad0.p10.m_data[0] = (float)local_1f8._0_4_;
              quad0.p10.m_data[1] = (float)local_1f8._4_4_;
              quad0.p10.m_data[2] = (float)local_1f8._8_4_;
              quad0.p10.m_data[3] = (float)local_1f8._12_4_;
              pSVar1 = (Sampler *)(*local_180 + local_1c0);
              if ((((long)uVar8 < 0) ||
                  (iVar11 = (int)(uVar8 >> 0x20), (*local_180)[local_1c0].m_size.m_data[0] <= iVar11
                  )) || (((int)local_1a8._0_4_ < 0 ||
                         (((int)pSVar1->minFilter <= (int)local_1a8._0_4_ ||
                          ((int)pSVar1->magFilter < 1)))))) {
                sampleTextureBorder<float>((TextureFormat *)local_1f8,pSVar1);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pSVar1,iVar11,(int)local_1a8._0_4_)
                ;
                format_01.order = pSVar1->wrapS;
                format_01.type = pSVar1->wrapT;
                bVar5 = isSRGB(format_01);
                if (bVar5) {
                  sRGBToLinear((tcu *)local_1f8,&quad1.p00);
                }
                else {
                  local_1f8._0_4_ = quad1.p00.m_data[0];
                  local_1f8._4_4_ = quad1.p00.m_data[1];
                  local_1f8._8_4_ = quad1.p00.m_data[2];
                  local_1f8._12_4_ = quad1.p00.m_data[3];
                }
              }
              quad0.p01.m_data[0] = (float)local_1f8._0_4_;
              quad0.p01.m_data[1] = (float)local_1f8._4_4_;
              quad0.p01.m_data[2] = (float)local_1f8._8_4_;
              quad0.p01.m_data[3] = (float)local_1f8._12_4_;
              pSVar1 = (Sampler *)(*local_180 + CONCAT44(uStack_1b4,local_1b8));
              if ((((local_1b0 < 0) ||
                   (iVar11 = (int)((ulong)local_1b0 >> 0x20),
                   (*local_180)[CONCAT44(uStack_1b4,local_1b8)].m_size.m_data[0] <= iVar11)) ||
                  (iVar12 < 0)) ||
                 (((int)pSVar1->minFilter <= iVar12 || ((int)pSVar1->magFilter < 1)))) {
                sampleTextureBorder<float>((TextureFormat *)local_1f8,pSVar1);
              }
              else {
                ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&quad1,(int)pSVar1,iVar11,iVar12);
                format_02.order = pSVar1->wrapS;
                format_02.type = pSVar1->wrapT;
                bVar5 = isSRGB(format_02);
                if (bVar5) {
                  sRGBToLinear((tcu *)local_1f8,&quad1.p00);
                }
                else {
                  local_1f8._0_4_ = quad1.p00.m_data[0];
                  local_1f8._4_4_ = quad1.p00.m_data[1];
                  local_1f8._8_4_ = quad1.p00.m_data[2];
                  local_1f8._12_4_ = quad1.p00.m_data[3];
                }
              }
              pvVar4 = local_1d8;
              quad0.p11.m_data[0] = (float)local_1f8._0_4_;
              quad0.p11.m_data[1] = (float)local_1f8._4_4_;
              quad0.p11.m_data[2] = (float)local_1f8._8_4_;
              quad0.p11.m_data[3] = (float)local_1f8._12_4_;
              TVar6 = local_1f8._24_4_;
              fVar18 = local_1c4;
              if (local_1f8._24_4_ == TEXTURECHANNELCLASS_FLOATING_POINT) {
                fVar18 = computeBilinearSearchStepFromFloatQuad(local_178,&quad0);
                TVar6 = extraout_EAX;
              }
              fVar20 = (vBounds0.m_data[0] + -0.5) - (float)(int)fVar17;
              fVar22 = (vBounds0.m_data[1] + -0.5) - (float)(int)fVar17;
              fVar23 = (uBounds0.m_data[0] + -0.5) - (float)(int)pvVar4;
              fVar24 = (uBounds0.m_data[1] + -0.5) - (float)(int)pvVar4;
              auVar25._4_4_ = -(uint)(fVar22 < 0.0);
              auVar25._0_4_ = -(uint)(fVar20 < 0.0);
              auVar25._8_4_ = -(uint)(fVar23 < 0.0);
              auVar25._12_4_ = -(uint)(fVar24 < 0.0);
              uVar7 = movmskps(TVar6,auVar25);
              local_14c = 0.0;
              local_150 = 0.0;
              if (((uVar7 & 4) == 0) && (local_150 = 1.0, fVar23 <= 1.0)) {
                local_150 = fVar23;
              }
              local_154 = 0.0;
              if (((uVar7 & 8) == 0) && (local_154 = 1.0, fVar24 <= 1.0)) {
                local_154 = fVar24;
              }
              local_158 = 0.0;
              if (((uVar7 & 1) == 0) && (local_158 = 1.0, fVar20 <= 1.0)) {
                local_158 = fVar20;
              }
              if (((uVar7 & 2) == 0) && (local_14c = 1.0, fVar22 <= 1.0)) {
                local_14c = fVar22;
              }
              fVar20 = local_168;
              if ((int)local_168 <= local_164) {
                do {
                  local_144 = (float)((int)fVar20 + 1);
                  if ((int)local_160 <= local_148) {
                    fVar22 = local_160;
                    do {
                      uVar31 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
                      uVar30 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
                      quad1.p11.m_data[0] = 0.0;
                      quad1.p11.m_data[1] = 0.0;
                      quad1.p11.m_data[2] = 0.0;
                      quad1.p11.m_data[3] = 0.0;
                      quad1.p10.m_data[0] = 0.0;
                      quad1.p10.m_data[1] = 0.0;
                      quad1.p10.m_data[2] = 0.0;
                      quad1.p10.m_data[3] = 0.0;
                      quad1.p01.m_data[0] = 0.0;
                      quad1.p01.m_data[1] = 0.0;
                      quad1.p01.m_data[2] = 0.0;
                      quad1.p01.m_data[3] = 0.0;
                      quad1.p00.m_data[0] = 0.0;
                      quad1.p00.m_data[1] = 0.0;
                      quad1.p00.m_data[2] = 0.0;
                      quad1.p00.m_data[3] = 0.0;
                      local_1f8._4_4_ = fVar22;
                      local_1f8._0_4_ = pCVar14->face;
                      local_1f8._8_4_ = fVar20;
                      CVar26 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_1f8,dim_00);
                      local_1a8 = CVar26._0_8_;
                      local_1b0 = CONCAT44(local_1b0._4_4_,CVar26.t);
                      fVar23 = (float)((int)fVar22 + 1);
                      local_1f8._4_4_ = fVar23;
                      local_1f8._0_4_ = pCVar14->face;
                      local_1f8._8_4_ = fVar20;
                      CVar26 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_1f8,dim_00);
                      fVar24 = local_144;
                      iVar11 = CVar26.t;
                      local_1f8._4_4_ = fVar22;
                      local_1f8._0_4_ = pCVar14->face;
                      local_1f8._8_4_ = local_144;
                      CVar27 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_1f8,dim_00);
                      local_1f8._28_4_ = CVar27.t;
                      local_1d8 = CVar27._0_8_;
                      local_1f8._4_4_ = fVar23;
                      local_1f8._0_4_ = pCVar14->face;
                      local_1f8._8_4_ = fVar24;
                      CVar27 = remapCubeEdgeCoords((CubeFaceIntCoords *)local_1f8,dim_00);
                      uVar8 = (ulong)local_1a8 & 0xffffffff;
                      if (uVar8 == 6) {
                        return true;
                      }
                      pVVar15 = (Vec2 *)((ulong)local_1d8 & 0xffffffff);
                      if ((int)local_1d8 == 6) {
                        return true;
                      }
                      uVar9 = CVar26._0_8_ & 0xffffffff;
                      if (CVar26.face == CUBEFACE_LAST) {
                        return true;
                      }
                      local_1d0 = (ulong)CVar27.face;
                      if (CVar27.face == CUBEFACE_LAST) {
                        return true;
                      }
                      local_1c0 = CVar27._0_8_;
                      local_1b8 = CVar27.t;
                      pSVar1 = (Sampler *)(*local_140 + uVar8);
                      xBounds1 = local_1a8;
                      if ((long)local_1a8 < 0) {
LAB_005ebe5e:
                        yBounds0 = pVVar15;
                        sampleTextureBorder<float>(&local_198,pSVar1);
                      }
                      else {
                        xBounds1 = (Vec2 *)((ulong)local_1a8 >> 0x20);
                        iVar12 = (int)((ulong)local_1a8 >> 0x20);
                        if (((((*local_140)[uVar8].m_size.m_data[0] <= iVar12) ||
                             ((int)(float)local_1b0 < 0)) ||
                            ((int)pSVar1->minFilter <= (int)(float)local_1b0)) ||
                           ((int)pSVar1->magFilter < 1)) goto LAB_005ebe5e;
                        yBounds0 = (Vec2 *)0x0;
                        ConstPixelBufferAccess::getPixel
                                  ((ConstPixelBufferAccess *)local_1f8,(int)pSVar1,iVar12,
                                   (int)(float)local_1b0);
                        format_03.order = pSVar1->wrapS;
                        format_03.type = pSVar1->wrapT;
                        bVar5 = isSRGB(format_03);
                        if (bVar5) {
                          sRGBToLinear((tcu *)&local_198,(Vec4 *)local_1f8);
                        }
                        else {
                          local_198.order = local_1f8._0_4_;
                          local_198.type = local_1f8._4_4_;
                          aiStack_190[0] = local_1f8._8_4_;
                          aiStack_190[1] = local_1f8._12_4_;
                        }
                      }
                      prec_00 = local_178;
                      quad1.p00.m_data[0] = (float)local_198.order;
                      quad1.p00.m_data[1] = (float)local_198.type;
                      quad1.p00.m_data[2] = (float)aiStack_190[0];
                      quad1.p00.m_data[3] = (float)aiStack_190[1];
                      pSVar1 = (Sampler *)(*local_140 + uVar9);
                      if ((((long)CVar26._0_8_ < 0) ||
                          ((*local_140)[uVar9].m_size.m_data[0] <= CVar26.s)) ||
                         ((iVar11 < 0 ||
                          (((int)pSVar1->minFilter <= iVar11 || ((int)pSVar1->magFilter < 1)))))) {
                        sampleTextureBorder<float>(&local_198,pSVar1);
                      }
                      else {
                        yBounds0 = (Vec2 *)0x0;
                        ConstPixelBufferAccess::getPixel
                                  ((ConstPixelBufferAccess *)local_1f8,(int)pSVar1,CVar26.s,iVar11);
                        format_04.order = pSVar1->wrapS;
                        format_04.type = pSVar1->wrapT;
                        bVar5 = isSRGB(format_04);
                        if (bVar5) {
                          sRGBToLinear((tcu *)&local_198,(Vec4 *)local_1f8);
                        }
                        else {
                          local_198.order = local_1f8._0_4_;
                          local_198.type = local_1f8._4_4_;
                          aiStack_190[0] = local_1f8._8_4_;
                          aiStack_190[1] = local_1f8._12_4_;
                        }
                      }
                      quad1.p10.m_data[0] = (float)local_198.order;
                      quad1.p10.m_data[1] = (float)local_198.type;
                      quad1.p10.m_data[2] = (float)aiStack_190[0];
                      quad1.p10.m_data[3] = (float)aiStack_190[1];
                      pSVar1 = (Sampler *)(*local_140 + (long)pVVar15);
                      if (((((long)local_1d8 < 0) ||
                           (iVar11 = (int)((ulong)local_1d8 >> 0x20),
                           (*local_140)[(long)pVVar15].m_size.m_data[0] <= iVar11)) ||
                          ((int)local_1f8._28_4_ < 0)) ||
                         (((int)pSVar1->minFilter <= (int)local_1f8._28_4_ ||
                          ((int)pSVar1->magFilter < 1)))) {
                        sampleTextureBorder<float>(&local_198,pSVar1);
                      }
                      else {
                        yBounds0 = (Vec2 *)0x0;
                        ConstPixelBufferAccess::getPixel
                                  ((ConstPixelBufferAccess *)local_1f8,(int)pSVar1,iVar11,
                                   local_1f8._28_4_);
                        format_05.order = pSVar1->wrapS;
                        format_05.type = pSVar1->wrapT;
                        bVar5 = isSRGB(format_05);
                        if (bVar5) {
                          sRGBToLinear((tcu *)&local_198,(Vec4 *)local_1f8);
                        }
                        else {
                          local_198.order = local_1f8._0_4_;
                          local_198.type = local_1f8._4_4_;
                          aiStack_190[0] = local_1f8._8_4_;
                          aiStack_190[1] = local_1f8._12_4_;
                        }
                      }
                      quad1.p01.m_data[0] = (float)local_198.order;
                      quad1.p01.m_data[1] = (float)local_198.type;
                      quad1.p01.m_data[2] = (float)aiStack_190[0];
                      quad1.p01.m_data[3] = (float)aiStack_190[1];
                      pSVar1 = (Sampler *)(*local_140 + local_1d0);
                      if ((((long)local_1c0 < 0) ||
                          (iVar11 = (int)(local_1c0 >> 0x20),
                          (*local_140)[local_1d0].m_size.m_data[0] <= iVar11)) ||
                         (((int)local_1b8 < 0 ||
                          (((int)pSVar1->minFilter <= (int)local_1b8 || ((int)pSVar1->magFilter < 1)
                           ))))) {
                        sampleTextureBorder<float>(&local_198,pSVar1);
                      }
                      else {
                        yBounds0 = (Vec2 *)0x0;
                        ConstPixelBufferAccess::getPixel
                                  ((ConstPixelBufferAccess *)local_1f8,(int)pSVar1,iVar11,local_1b8)
                        ;
                        format_06.order = pSVar1->wrapS;
                        format_06.type = pSVar1->wrapT;
                        bVar5 = isSRGB(format_06);
                        if (bVar5) {
                          sRGBToLinear((tcu *)&local_198,(Vec4 *)local_1f8);
                        }
                        else {
                          local_198.order = local_1f8._0_4_;
                          local_198.type = local_1f8._4_4_;
                          aiStack_190[0] = local_1f8._8_4_;
                          aiStack_190[1] = local_1f8._12_4_;
                        }
                      }
                      quad1.p11.m_data[0] = (float)local_198.order;
                      quad1.p11.m_data[1] = (float)local_198.type;
                      quad1.p11.m_data[2] = (float)aiStack_190[0];
                      quad1.p11.m_data[3] = (float)aiStack_190[1];
                      fVar24 = local_1c4;
                      TVar6 = local_1f8._24_4_;
                      if (local_1f8._24_4_ == TEXTURECHANNELCLASS_FLOATING_POINT) {
                        fVar24 = computeBilinearSearchStepFromFloatQuad(prec_00,&quad1);
                        TVar6 = extraout_EAX_00;
                      }
                      auVar3._4_4_ = -(uint)((vBounds1.m_data[1] + -0.5) - (float)(int)fVar20 < 0.0)
                      ;
                      auVar3._0_4_ = -(uint)((vBounds1.m_data[0] + -0.5) - (float)(int)fVar20 < 0.0)
                      ;
                      auVar3._8_4_ = -(uint)((uBounds1.m_data[0] + -0.5) - (float)(int)fVar22 < 0.0)
                      ;
                      auVar3._12_4_ =
                           -(uint)((uBounds1.m_data[1] + -0.5) - (float)(int)fVar22 < 0.0);
                      movmskps(TVar6,auVar3);
                      in_stack_fffffffffffffde0 = (Vec2 *)CONCAT44(uVar30,fBounds->m_data[1]);
                      in_stack_fffffffffffffde8 =
                           (Vec4 *)CONCAT44(uVar31,~-(uint)(fVar18 <= fVar24) & (uint)fVar24 |
                                                   -(uint)(fVar18 <= fVar24) & (uint)fVar18);
                      bVar5 = is2DTrilinearFilterResultValid
                                        (prec_00,&quad0,&quad1,(Vec2 *)result,yBounds0,xBounds1,
                                         (Vec2 *)CONCAT44(in_stack_fffffffffffffddc,
                                                          fBounds->m_data[0]),
                                         in_stack_fffffffffffffde0,local_150,
                                         in_stack_fffffffffffffde8);
                      if (bVar5) {
                        return true;
                      }
                      pCVar14 = local_170;
                      fVar22 = fVar23;
                    } while ((int)fVar23 <= local_148);
                  }
                  fVar20 = local_144;
                } while ((int)local_144 <= local_164);
              }
              TVar6 = local_1f8._24_4_;
              fVar18 = fVar13;
            } while ((int)fVar13 <= iVar10);
          }
          bVar5 = false;
          fVar17 = local_15c;
        } while ((int)local_15c <= (int)fVar19);
      }
    }
    else {
      quad0.p00.m_data[0] = coords->s;
      quad0.p00.m_data[1] = coords->t;
      bVar5 = isLinearMipmapLinearSampleResultValid
                        (*faces0 + CVar2,*faces1 + CVar2,sampler,prec,(Vec2 *)&quad0,0,fBounds,
                         result);
    }
  }
  else {
    quad0.p00.m_data[0] = coords->s;
    quad0.p00.m_data[1] = coords->t;
    bVar5 = isNearestMipmapLinearSampleResultValid
                      (*faces0 + coords->face,*faces1 + coords->face,sampler,prec,(Vec2 *)&quad0,0,
                       fBounds,result);
  }
  return bVar5;
}

Assistant:

static bool isCubeMipmapLinearSampleResultValid (const ConstPixelBufferAccess	(&faces0)[CUBEFACE_LAST],
												 const ConstPixelBufferAccess	(&faces1)[CUBEFACE_LAST],
												 const Sampler&					sampler,
												 const Sampler::FilterMode		levelFilter,
												 const LookupPrecision&			prec,
												 const CubeFaceFloatCoords&		coords,
												 const Vec2&					fBounds,
												 const Vec4&					result)
{
	if (levelFilter == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamplessLinearMipmapLinearSampleResultValid(faces0, faces1, sampler, prec, coords, fBounds, result);
		else
			return isLinearMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
	}
	else
		return isNearestMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
}